

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricStreamerOpenPrologue
          (ZETHandleLifetimeValidation *this,zet_context_handle_t hContext,
          zet_device_handle_t hDevice,zet_metric_group_handle_t hMetricGroup,
          zet_metric_streamer_desc_t *desc,ze_event_handle_t hNotificationEvent,
          zet_metric_streamer_handle_t *phMetricStreamer)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hContext);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (((bVar2) &&
      (bVar2 = HandleLifetimeValidation::isHandleValid
                         (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hDevice), bVar2)) &&
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hMetricGroup), bVar2)) {
    if ((hNotificationEvent != (ze_event_handle_t)0x0) &&
       (bVar2 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hNotificationEvent), !bVar2
       )) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
    zVar3 = ZE_RESULT_SUCCESS;
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricStreamerOpenPrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        zet_metric_streamer_desc_t* desc,               ///< [in,out] metric streamer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification
        zet_metric_streamer_handle_t* phMetricStreamer  ///< [out] handle of metric streamer
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hMetricGroup )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (hNotificationEvent && !context.handleLifetime->isHandleValid( hNotificationEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }